

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rgba *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  DepthImage im_1;
  string n_frames_str;
  string pat_out;
  string pat_d2;
  string pat_c2;
  string pat_d1;
  string pat_c1;
  DepthImage im_2;
  string local_1b8;
  long local_198;
  string local_190;
  DepthImage local_170;
  Rgba *local_130 [2];
  Rgba local_120 [2];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  DepthImage local_70;
  
  puts("\n=============================");
  printf("Randy depth composer utility");
  puts("\n=============================");
  if (argc != 7) {
    puts("Usage : dcompose <number of frames> <pattern c1> <d1> <c2> <d2> <out>");
    putchar(10);
    return -1;
  }
  std::__cxx11::string::string((string *)local_130,argv[1],(allocator *)&local_170);
  std::__cxx11::string::string((string *)&local_90,argv[2],(allocator *)&local_170);
  std::__cxx11::string::string((string *)&local_b0,argv[3],(allocator *)&local_170);
  std::__cxx11::string::string((string *)&local_d0,argv[4],(allocator *)&local_170);
  std::__cxx11::string::string((string *)&local_f0,argv[5],(allocator *)&local_170);
  std::__cxx11::string::string((string *)&local_110,argv[6],(allocator *)&local_170);
  __nptr = local_130[0];
  piVar2 = __errno_location();
  iVar5 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol((char *)__nptr,(char **)&local_170,10);
  if (local_170.color.m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
      _M_impl.super__Vector_impl_data._M_start == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar5;
    }
    DepthImage::DepthImage(&local_170);
    DepthImage::DepthImage(&local_70);
    local_198 = lVar3;
    if (0 < (int)lVar3) {
      paVar1 = &local_190.field_2;
      iVar5 = 0;
      do {
        PatternToName(&local_190,&local_90,iVar5);
        PatternToName(&local_1b8,&local_b0,iVar5);
        DepthImage::EmplaceData(&local_170,&local_190,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        PatternToName(&local_190,&local_d0,iVar5);
        PatternToName(&local_1b8,&local_f0,iVar5);
        DepthImage::EmplaceData(&local_70,&local_190,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        DepthImage::PrintInfo(&local_170);
        DepthImage::PrintInfo(&local_70);
        DepthImage::operator+=(&local_170,&local_70);
        PatternToName(&local_190,&local_110,iVar5);
        DepthImage::SaveToPNG(&local_170,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        iVar5 = iVar5 + 1;
      } while ((int)local_198 != iVar5);
    }
    if (local_70.depth.m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.depth.m_Data.
                      super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_70.color.m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.color.m_Data.
                      super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_170.depth.m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.depth.m_Data.
                      super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_170.color.m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
        _M_impl.super__Vector_impl_data._M_start != (Rgba *)0x0) {
      operator_delete(local_170.color.m_Data.
                      super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_130[0] == local_120) {
      return 0;
    }
    operator_delete(local_130[0]);
    return 0;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  DepthImage::~DepthImage(&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

int main(int argc, char *argv[]) {

    printf("\n=============================\n");
    printf("Randy depth composer utility");
    printf("\n=============================\n");

    /*Test();
    return 0;*/

    // omp_set_num_threads(2);

    if (argc != 7) {
        PrintUsage();
        return -1;
    }

    // Patse args
    std::string n_frames_str(argv[1]);
    std::string pat_c1(argv[2]);
    std::string pat_d1(argv[3]);
    std::string pat_c2(argv[4]);
    std::string pat_d2(argv[5]);
    std::string pat_out(argv[6]);
    int n_frames = 0;

    try {
        n_frames = std::stoi(n_frames_str);
    } catch (...) {
        printf("Can't parse %s as a number\n", n_frames_str.c_str());
        PrintUsage();
        return -1;
    }

    // Process textures, each thread gets an image and
    // reuses it over and over to avoid reallocations
    DepthImage im_1, im_2;

// #pragma omp parallel for private(im_1, im_2)
    for (int i = 0; i < n_frames; ++i) {

        // auto tid = omp_get_thread_num();
        // parallel_printf("\nThread #%d for task #%d \n\n", tid, i);

        // Image 1
        im_1.EmplaceData(PatternToName(pat_c1, i), PatternToName(pat_d1, i));

        // Image 2
        im_2.EmplaceData(PatternToName(pat_c2, i), PatternToName(pat_d2, i));

        // Print
        im_1.PrintInfo();
        im_2.PrintInfo();

        // Compose
        im_1 += im_2;


        // Save
        im_1.SaveToPNG(PatternToName(pat_out, i));
    }

    return 0;
}